

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

void __thiscall
gl3cts::TransformFeedback::QueryVertexInterleaved::createTransformFeedbackBuffer
          (QueryVertexInterleaved *this)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  QueryVertexInterleaved *this_local;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_CaptureVertexInterleaved).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  CaptureVertexInterleaved::createTransformFeedbackBuffer(&this->super_CaptureVertexInterleaved);
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x6e0))(1,&this->m_query_object);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"glGenQueries call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xf15);
  return;
}

Assistant:

void gl3cts::TransformFeedback::QueryVertexInterleaved::createTransformFeedbackBuffer(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create buffer object. */
	gl3cts::TransformFeedback::CaptureVertexInterleaved::createTransformFeedbackBuffer();

	/* Create query object. */
	gl.genQueries(1, &m_query_object);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenQueries call failed.");
}